

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int json_array_remove(json_t *json,size_t index)

{
  json_array_t *array;
  size_t index_local;
  json_t *json_local;
  
  if ((json == (json_t *)0x0) || (json->type != JSON_ARRAY)) {
    json_local._4_4_ = -1;
  }
  else if (index < json[1].refcount) {
    json_decref(*(json_t **)(*(long *)(json + 2) + index * 8));
    if (index < json[1].refcount - 1) {
      array_move((json_array_t *)json,index,index + 1,(json[1].refcount - index) - 1);
    }
    json[1].refcount = json[1].refcount - 1;
    json_local._4_4_ = 0;
  }
  else {
    json_local._4_4_ = -1;
  }
  return json_local._4_4_;
}

Assistant:

int json_array_remove(json_t *json, size_t index)
{
	json_array_t *array;

	if (!json_is_array(json))
		return -1;
	array = json_to_array(json);

	if (index >= array->entries)
		return -1;

	json_decref(array->table[index]);

	/* If we're removing the last element, nothing has to be moved */
	if (index < array->entries - 1)
		array_move(array, index, index + 1, array->entries - index - 1);

	array->entries--;

	return 0;
}